

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  int iVar3;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  jpeg_error_mgr *pjVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int symbol;
  int iVar12;
  long lVar13;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  pjVar4 = cinfo->dest;
  entropy->next_output_byte = pjVar4->next_output_byte;
  entropy->free_in_buffer = pjVar4->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar2 = cinfo->Se;
  iVar3 = cinfo->Al;
  piVar5 = cinfo->natural_order;
  paJVar6 = *MCU_data;
  lVar13 = (long)cinfo->Ss;
  iVar12 = 0;
  do {
    if (iVar2 < lVar13) {
      if ((0 < iVar12) && (uVar11 = entropy->EOBRUN + 1, entropy->EOBRUN = uVar11, uVar11 == 0x7fff)
         ) {
        emit_eobrun(entropy);
      }
      pjVar4 = cinfo->dest;
      pjVar4->next_output_byte = entropy->next_output_byte;
      pjVar4->free_in_buffer = entropy->free_in_buffer;
      uVar11 = cinfo->restart_interval;
      if (uVar11 != 0) {
        uVar9 = entropy->restarts_to_go;
        if (entropy->restarts_to_go == 0) {
          entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
          uVar9 = uVar11;
        }
        entropy->restarts_to_go = uVar9 - 1;
      }
      return 1;
    }
    sVar1 = (*paJVar6)[piVar5[lVar13]];
    if (sVar1 == 0) {
LAB_001143d9:
      iVar12 = iVar12 + 1;
    }
    else {
      bVar8 = (byte)iVar3;
      uVar10 = (uint)-(int)sVar1 >> (bVar8 & 0x1f);
      uVar11 = (uint)(int)sVar1 >> (bVar8 & 0x1f);
      uVar9 = uVar11;
      if (sVar1 < 0) {
        uVar11 = uVar10;
        uVar9 = ~uVar10;
      }
      if (uVar11 == 0) goto LAB_001143d9;
      if (entropy->EOBRUN != 0) {
        emit_eobrun(entropy);
      }
      symbol = iVar12 * 0x10 + 1;
      for (; 0xf < iVar12; iVar12 = iVar12 + -0x10) {
        emit_ac_symbol(entropy,entropy->ac_tbl_no,0xf0);
        symbol = symbol + -0x100;
      }
      uVar10 = 1;
      for (; 1 < uVar11; uVar11 = uVar11 >> 1) {
        uVar10 = uVar10 + 1;
        symbol = symbol + 1;
      }
      if (10 < uVar10) {
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 6;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      emit_ac_symbol(entropy,entropy->ac_tbl_no,symbol);
      emit_bits_e(entropy,uVar9,uVar10);
      iVar12 = 0;
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);		/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  arith_encode(cinfo, st + 1, 1);
	  arith_encode(cinfo, entropy->fixed_bin, 0);
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  arith_encode(cinfo, st + 1, 1);
	  arith_encode(cinfo, entropy->fixed_bin, 1);
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
	arith_encode(cinfo, st, 1);
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}